

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

int decim(char *r,uint64_t v,char chars,char leading)

{
  char *pcVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)((byte)chars - 1);
  pcVar1 = r + uVar4 + 1;
  uVar3 = 1;
  for (; -1 < (int)uVar4; uVar4 = (ulong)((int)uVar4 - 1)) {
    bVar2 = (leading != '\0') << 4 | 0x20;
    if (uVar3 <= v) {
      bVar2 = (byte)((v / uVar3) % 10) | 0x30;
    }
    pcVar1[-1] = bVar2;
    pcVar1 = pcVar1 + -1;
    uVar3 = uVar3 * 10;
  }
  if (uVar3 <= v) {
    *pcVar1 = '!';
  }
  return (uint)(byte)chars;
}

Assistant:

static int
decim(char *r, uint64_t v, char chars, char leading)
{
	int n = chars - 1;
	uint64_t q = 1;

	r += n;

	while (n >= 0) {
		if (v / q)
			*r-- = '0' + ((v / q) % 10);
		else
			*r-- = leading ? '0' : ' ';
		q = q * 10;
		n--;
	}

	if (v / q)
		/* the number is bigger than the allowed chars! */
		r[1] = '!';

	return chars;
}